

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev-lang-demo.cpp
# Opt level: O3

void button_menu(void)

{
  char *pcVar1;
  bool bVar2;
  ulong in_RAX;
  ostream *poVar3;
  long *plVar4;
  undefined1 *this;
  char c;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX & 0xffffffffffffff;
  do {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"*** button menu ***",0x13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    plVar4 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(1) back",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(2) left",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(3) right",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(4) up",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(5) down",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(6) enter",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    plVar4 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(b)ack",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    plVar4 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Choice: ",8);
    std::operator>>((istream *)&std::cin,(char *)((long)&uStack_38 + 7));
    switch(uStack_38._7_1_) {
    case '1':
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
      std::ostream::put('@');
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"back button is ",0xf);
      this = ev3dev::button::back;
      break;
    case '2':
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
      std::ostream::put('@');
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"left button is ",0xf);
      this = ev3dev::button::left;
      break;
    case '3':
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
      std::ostream::put('@');
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"right button is ",0x10);
      this = ev3dev::button::right;
      break;
    case '4':
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
      std::ostream::put('@');
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"up button is ",0xd);
      this = ev3dev::button::up;
      break;
    case '5':
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
      std::ostream::put('@');
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"down button is ",0xf);
      this = ev3dev::button::down;
      break;
    case '6':
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
      std::ostream::put('@');
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"enter button is ",0x10);
      this = ev3dev::button::enter;
      break;
    default:
      goto switchD_0011325c_default;
    }
    bVar2 = ev3dev::button::pressed((button *)this);
    pcVar1 = "(4) up";
    if (bVar2) {
      pcVar1 = "(5) down";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar1 + 4,(ulong)bVar2 * 2 + 2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
switchD_0011325c_default:
    if (uStack_38._7_1_ == 'b') {
      return;
    }
  } while( true );
}

Assistant:

void button_menu()
{
  char c = 0;
  do
  {
    cout << endl
         << "*** button menu ***" << endl
         << endl
         << "(1) back"  << endl
         << "(2) left"  << endl
         << "(3) right" << endl
         << "(4) up"    << endl
         << "(5) down"  << endl
         << "(6) enter" << endl
         << endl
         << "(b)ack"    << endl
         << endl
         << "Choice: ";
    cin >> c;

    switch (c)
    {
    case '1':
      cout << endl << "back button is " << (button::back.pressed() ? "down" : "up") << endl;
      break;
    case '2':
      cout << endl << "left button is " << (button::left.pressed() ? "down" : "up") << endl;
      break;
    case '3':
      cout << endl << "right button is " << (button::right.pressed() ? "down" : "up") << endl;
      break;
    case '4':
      cout << endl << "up button is " << (button::up.pressed() ? "down" : "up") << endl;
      break;
    case '5':
      cout << endl << "down button is " << (button::down.pressed() ? "down" : "up") << endl;
      break;
    case '6':
      cout << endl << "enter button is " << (button::enter.pressed() ? "down" : "up") << endl;
      break;
    }
  }
  while (c != 'b');
}